

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

bool __thiscall
flatbuffers::Parser::Parse(Parser *this,char *source,char **include_paths,char *source_filename)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  byte bVar4;
  undefined8 in_RAX;
  undefined1 auStack_28 [7];
  undefined1 local_21;
  
  iVar1 = this->parse_depth_counter_;
  _auStack_28 = in_RAX;
  if ((this->opts).use_flexbuffers == true) {
    bVar4 = ParseFlexBuffer(this,source,source_filename,&this->flex_builder_);
  }
  else {
    ParseRoot((Parser *)(auStack_28 + 6),(char *)this,(char **)source,(char *)include_paths);
    uVar2 = _auStack_28;
    _auStack_28 = CONCAT17(1,auStack_28);
    uVar3 = _auStack_28;
    auStack_28[6] = SUB81(uVar2,6);
    bVar4 = auStack_28[6] ^ 1;
    _auStack_28 = uVar3;
    CheckedError::~CheckedError((CheckedError *)(auStack_28 + 6));
  }
  if (iVar1 == this->parse_depth_counter_) {
    return (bool)bVar4;
  }
  __assert_fail("initial_depth == parse_depth_counter_",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_parser.cpp"
                ,0xd92,"bool flatbuffers::Parser::Parse(const char *, const char **, const char *)")
  ;
}

Assistant:

bool Parser::Parse(const char *source, const char **include_paths,
                   const char *source_filename) {
  const auto initial_depth = parse_depth_counter_;
  (void)initial_depth;
  bool r;

  if (opts.use_flexbuffers) {
    r = ParseFlexBuffer(source, source_filename, &flex_builder_);
  } else {
    r = !ParseRoot(source, include_paths, source_filename).Check();
  }
  FLATBUFFERS_ASSERT(initial_depth == parse_depth_counter_);
  return r;
}